

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall
ScriptHash_ScriptHash_hex_exception_Test::ScriptHash_ScriptHash_hex_exception_Test
          (ScriptHash_ScriptHash_hex_exception_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c3bc0;
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex_exception) {
  try {
    std::string hex("xxxx");
    ScriptHash script_hash(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}